

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_exception.hpp
# Opt level: O0

void __thiscall
duckdb::ConversionException::ConversionException<long>
          (ConversionException *this,string *msg,long params)

{
  long in_RSI;
  string *in_RDI;
  string local_38 [40];
  
  Exception::ConstructMessage<long>(in_RDI,in_RSI);
  duckdb::ConversionException::ConversionException((ConversionException *)in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

explicit ConversionException(const string &msg, ARGS... params)
	    : ConversionException(ConstructMessage(msg, params...)) {
	}